

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

void helicsDataBufferToRawString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  DataType baseType;
  SmallBuffer *pSVar1;
  string v;
  data_view local_58;
  string local_38;
  
  if ((outputString != (char *)0x0 && 0 < maxStringLen) &&
     (pSVar1 = getBuffer(data), pSVar1 != (SmallBuffer *)0x0)) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_58.dblock._M_len = pSVar1->bufferSize;
    local_58.dblock._M_str = (char *)pSVar1->heap;
    local_58.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_58.dblock._M_str);
    helics::valueExtract(&local_58,baseType,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((int)local_38._M_string_length < maxStringLen) {
      maxStringLen = (int)local_38._M_string_length;
    }
    memcpy(outputString,local_38._M_dataplus._M_p,(long)maxStringLen);
    if (actualLength != (int *)0x0) {
      *actualLength = maxStringLen;
    }
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  if (actualLength != (int *)0x0) {
    *actualLength = 0;
  }
  return;
}

Assistant:

void helicsDataBufferToRawString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    // NOLINTNEXTLINE
    std::memcpy(outputString, v.data(), length);

    if (actualLength != nullptr) {
        *actualLength = length;
    }
}